

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O0

MatrixXd * ChebTools::Schur_matrixT(MatrixXd *__return_storage_ptr__,MatrixXd *A,bool balance)

{
  Index IVar1;
  Index IVar2;
  MatrixType *other;
  IdentityReturnType local_120;
  IdentityReturnType local_108;
  undefined1 local_f0 [8];
  MatrixXd D;
  undefined1 local_c8 [8];
  MatrixXd Abalanced;
  RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> schur;
  bool balance_local;
  MatrixXd *A_local;
  
  Eigen::RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::RealSchur
            ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols,1);
  if (balance) {
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_c8);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_f0);
    balance_matrix(A,(MatrixXd *)local_c8,(MatrixXd *)local_f0);
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_108,IVar1,IVar2);
    Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    computeFromHessenberg<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
               &Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_cols,(Matrix<double,__1,__1,_0,__1,__1> *)local_c8,&local_108,false);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_f0)
    ;
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_c8)
    ;
  }
  else {
    IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    IVar2 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&A->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>);
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Identity(&local_120,IVar1,IVar2);
    Eigen::RealSchur<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    computeFromHessenberg<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((RealSchur<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)
               &Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                .m_cols,A,&local_120,false);
  }
  other = Eigen::RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::matrixT
                    ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
                     &Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_cols);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(__return_storage_ptr__,other);
  Eigen::RealSchur<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~RealSchur
            ((RealSchur<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
             &Abalanced.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols);
  return __return_storage_ptr__;
}

Assistant:

Eigen::MatrixXd Schur_matrixT(const Eigen::MatrixXd &A, bool balance){
        Eigen::RealSchur<Eigen::MatrixXd> schur;
        if (balance) {
            Eigen::MatrixXd Abalanced, D;
            balance_matrix(A, Abalanced, D);
            schur.computeFromHessenberg(Abalanced, Eigen::MatrixXd::Identity(A.rows(), A.cols()), false);
        }
        else {
            schur.computeFromHessenberg(A, Eigen::MatrixXd::Identity(A.rows(), A.cols()), false);
        }
        
        return schur.matrixT();
    }